

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O1

void __thiscall test::OWDTimeStatistics::PrintStatistics(OWDTimeStatistics *this)

{
  ostringstream *poVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  OutputWorker *pOVar18;
  OWDTimeStatistics *pOVar19;
  _ValueType __value;
  ulong uVar20;
  unsigned_long uVar21;
  OWDTimeStatistics *pOVar22;
  OWDTimeStatistics *pOVar23;
  OWDTimeStatistics *pOVar24;
  OWDTimeStatistics *pOVar25;
  unsigned_long *__i_1;
  long lVar26;
  OWDTimeStatistics *pOVar27;
  unsigned_long __tmp_1;
  ulong uVar28;
  ulong uVar29;
  OWDTimeStatistics *pOVar30;
  unsigned_long *__i;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM1 [16];
  undefined1 local_1b8 [392];
  
  uVar29 = (ulong)this->SampleCount;
  fVar33 = 0.0;
  fVar32 = 0.0;
  if (200 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = auVar17._0_8_ * 0.99;
    uVar28 = vcvttsd2usi_avx512f(auVar39);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar2._0_4_ = pOVar27[-1].SampleCount;
          uVar2._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar2) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar2 <= uVar13) goto LAB_001118ef;
              (pOVar30->Samples)._M_elems[0] = uVar2;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar2) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_001118ef:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar2) {
              (pOVar30->Samples)._M_elems[0] = uVar2;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar14._0_4_ = pOVar25[-1].SampleCount;
              uVar14._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar14);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar14;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_001119fe;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__0>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_001119fe:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar32 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  if (100 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auVar17._0_8_ * 0.95;
    uVar28 = vcvttsd2usi_avx512f(auVar40);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar3._0_4_ = pOVar27[-1].SampleCount;
          uVar3._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar3) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar3 <= uVar13) goto LAB_00111aa8;
              (pOVar30->Samples)._M_elems[0] = uVar3;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar3) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_00111aa8:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar3) {
              (pOVar30->Samples)._M_elems[0] = uVar3;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar4._0_4_ = pOVar25[-1].SampleCount;
              uVar4._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar4);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar4;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_00111bb7;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__1>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_00111bb7:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar33 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  fVar35 = 0.0;
  fVar34 = 0.0;
  if (4 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auVar17._0_8_ * 0.75;
    uVar28 = vcvttsd2usi_avx512f(auVar41);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar5._0_4_ = pOVar27[-1].SampleCount;
          uVar5._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar5) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar5 <= uVar13) goto LAB_00111c71;
              (pOVar30->Samples)._M_elems[0] = uVar5;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar5) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_00111c71:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar5) {
              (pOVar30->Samples)._M_elems[0] = uVar5;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar6._0_4_ = pOVar25[-1].SampleCount;
              uVar6._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar6);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar6;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_00111d80;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__2>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_00111d80:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar34 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  if (4 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auVar17._0_8_ * 0.5;
    uVar28 = vcvttsd2usi_avx512f(auVar42);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar7._0_4_ = pOVar27[-1].SampleCount;
          uVar7._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar7) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar7 <= uVar13) goto LAB_00111e2a;
              (pOVar30->Samples)._M_elems[0] = uVar7;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar7) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_00111e2a:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar7) {
              (pOVar30->Samples)._M_elems[0] = uVar7;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar8._0_4_ = pOVar25[-1].SampleCount;
              uVar8._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar8);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar8;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_00111f39;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__3>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_00111f39:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar35 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  fVar37 = 0.0;
  fVar36 = 0.0;
  if (8 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auVar17._0_8_ * 0.25;
    uVar28 = vcvttsd2usi_avx512f(auVar43);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar9._0_4_ = pOVar27[-1].SampleCount;
          uVar9._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar9) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar9 <= uVar13) goto LAB_00111ff3;
              (pOVar30->Samples)._M_elems[0] = uVar9;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar9) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_00111ff3:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar9) {
              (pOVar30->Samples)._M_elems[0] = uVar9;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar10._0_4_ = pOVar25[-1].SampleCount;
              uVar10._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar10);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar10;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_00112102;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__4>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_00112102:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar36 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  if (0x28 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar17._0_8_ * 0.05;
    uVar28 = vcvttsd2usi_avx512f(auVar44);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar11._0_4_ = pOVar27[-1].SampleCount;
          uVar11._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar11) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar11 <= uVar13) goto LAB_001121ac;
              (pOVar30->Samples)._M_elems[0] = uVar11;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar11) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_001121ac:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar11) {
              (pOVar30->Samples)._M_elems[0] = uVar11;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar12._0_4_ = pOVar25[-1].SampleCount;
              uVar12._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar12);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar12;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_001122bb;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__5>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_001122bb:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar37 = auVar17._0_4_;
  }
  uVar29 = (ulong)this->SampleCount;
  fVar38 = 0.0;
  if (200 < uVar29) {
    auVar17 = vcvtusi2sd_avx512f(in_XMM1,this->SampleCount);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auVar17._0_8_ * 0.01;
    uVar28 = vcvttsd2usi_avx512f(auVar45);
    if (uVar28 != uVar29) {
      pOVar19 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar28);
      pOVar27 = (OWDTimeStatistics *)((this->Samples)._M_elems + uVar29);
      pOVar30 = this;
      if (LZCOUNT(uVar29) != 0x3f) {
        uVar20 = uVar29 << 3;
        uVar29 = (ulong)(uint)((int)LZCOUNT(uVar29) * 2) ^ 0x7e;
        do {
          uVar20 = uVar20 >> 4;
          uVar13 = (pOVar30->Samples)._M_elems[1];
          uVar14 = (pOVar30->Samples)._M_elems[uVar20];
          uVar15._0_4_ = pOVar27[-1].SampleCount;
          uVar15._4_4_ = pOVar27[-1].SampleIndex;
          if (uVar13 < uVar14) {
            if (uVar14 < uVar15) {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
            else {
              uVar21 = (pOVar30->Samples)._M_elems[0];
              if (uVar15 <= uVar13) goto LAB_00112372;
              (pOVar30->Samples)._M_elems[0] = uVar15;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
          }
          else if (uVar13 < uVar15) {
            uVar21 = (pOVar30->Samples)._M_elems[0];
LAB_00112372:
            (pOVar30->Samples)._M_elems[0] = uVar13;
            (pOVar30->Samples)._M_elems[1] = uVar21;
          }
          else {
            uVar21 = (pOVar30->Samples)._M_elems[0];
            if (uVar14 < uVar15) {
              (pOVar30->Samples)._M_elems[0] = uVar15;
              pOVar27[-1].SampleCount = (int)uVar21;
              pOVar27[-1].SampleIndex = (int)(uVar21 >> 0x20);
            }
            else {
              (pOVar30->Samples)._M_elems[0] = uVar14;
              (pOVar30->Samples)._M_elems[uVar20] = uVar21;
            }
          }
          uVar29 = uVar29 - 1;
          pOVar22 = (OWDTimeStatistics *)((pOVar30->Samples)._M_elems + 1);
          pOVar24 = pOVar27;
          while( true ) {
            uVar20 = (pOVar30->Samples)._M_elems[0];
            do {
              pOVar23 = pOVar22;
              uVar13 = (pOVar23->Samples)._M_elems[0];
              pOVar22 = (OWDTimeStatistics *)((pOVar23->Samples)._M_elems + 1);
            } while (uVar13 < uVar20);
            do {
              pOVar25 = pOVar24;
              uVar16._0_4_ = pOVar25[-1].SampleCount;
              uVar16._4_4_ = pOVar25[-1].SampleIndex;
              pOVar24 = (OWDTimeStatistics *)&pOVar25[-1].SampleCount;
            } while (uVar20 < uVar16);
            if (pOVar24 <= pOVar23) break;
            (pOVar23->Samples)._M_elems[0] = uVar16;
            pOVar25[-1].SampleCount = (int)uVar13;
            pOVar25[-1].SampleIndex = (int)(uVar13 >> 0x20);
          }
          if (pOVar23 <= pOVar19) {
            pOVar30 = pOVar23;
            pOVar23 = pOVar27;
          }
          pOVar27 = pOVar23;
          uVar20 = (long)pOVar27 - (long)pOVar30;
          if ((long)uVar20 < 0x19) {
            pOVar19 = pOVar30;
            if (pOVar30 != pOVar27) {
              while (pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1),
                    pOVar22 != pOVar27) {
                uVar29 = (pOVar19->Samples)._M_elems[1];
                if (uVar29 < (pOVar30->Samples)._M_elems[0]) {
                  memmove((void *)((long)pOVar19 + (0x10 - ((long)pOVar22 - (long)pOVar30))),pOVar30
                          ,(long)pOVar22 - (long)pOVar30);
                  pOVar19 = pOVar30;
                }
                else {
                  uVar20 = (pOVar19->Samples)._M_elems[0];
                  pOVar19 = pOVar22;
                  while (uVar29 < uVar20) {
                    (pOVar19->Samples)._M_elems[0] = uVar20;
                    pOVar24 = pOVar19 + -1;
                    pOVar19 = (OWDTimeStatistics *)&pOVar19[-1].SampleCount;
                    uVar20 = (pOVar24->Samples)._M_elems[999];
                  }
                }
                (pOVar19->Samples)._M_elems[0] = uVar29;
                pOVar19 = pOVar22;
              }
            }
            goto LAB_00112481;
          }
        } while (uVar29 != 0);
      }
      pOVar22 = (OWDTimeStatistics *)((pOVar19->Samples)._M_elems + 1);
      lVar26 = (long)pOVar22 - (long)pOVar30 >> 3;
      if (1 < lVar26) {
        uVar29 = lVar26 - 2U >> 1;
        do {
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                    (pOVar30,uVar29,lVar26,(pOVar30->Samples)._M_elems[uVar29]);
          bVar31 = uVar29 != 0;
          uVar29 = uVar29 - 1;
        } while (bVar31);
      }
      for (; pOVar22 < pOVar27; pOVar22 = (OWDTimeStatistics *)((pOVar22->Samples)._M_elems + 1)) {
        uVar29 = (pOVar30->Samples)._M_elems[0];
        if ((pOVar22->Samples)._M_elems[0] < uVar29) {
          (pOVar22->Samples)._M_elems[0] = uVar29;
          std::
          __adjust_heap<unsigned_long*,long,unsigned_long,__gnu_cxx::__ops::_Iter_comp_iter<test::OWDTimeStatistics::PrintStatistics()::__6>>
                    (pOVar30,0,lVar26);
        }
      }
      uVar21 = (pOVar30->Samples)._M_elems[0];
      (pOVar30->Samples)._M_elems[0] = (pOVar19->Samples)._M_elems[0];
      (pOVar19->Samples)._M_elems[0] = uVar21;
    }
LAB_00112481:
    auVar17 = vcvtusi2ss_avx512f(in_XMM1,(this->Samples)._M_elems[uVar28]);
    fVar38 = auVar17._0_4_;
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way  1% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar32 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way  5% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar33 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way 25% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar34 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way 50% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar35 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec (median)",0xe);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way 75% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar36 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way 95% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar37 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if (DAT_001bd6d8 < 3) {
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._0_8_ = Logger;
    local_1b8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"One-way 99% percentile latency = ",0x21);
    std::ostream::_M_insert<double>((double)(fVar38 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," msec",5);
    pOVar18 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar18,(LogStringBuffer *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  return;
}

Assistant:

void OWDTimeStatistics::PrintStatistics()
{
    uint64_t percentile1 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.99 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile1 = Samples[goalOffset];
    }

    uint64_t percentile5 = 0;
    if (SampleCount > 100)
    {
        offset_t goalOffset = (offset_t)(0.95 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile5 = Samples[goalOffset];
    }

    uint64_t percentile25 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.75 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile25 = Samples[goalOffset];
    }

    uint64_t percentile50 = 0;
    if (SampleCount > 4)
    {
        offset_t goalOffset = (offset_t)(0.5 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile50 = Samples[goalOffset];
    }

    uint64_t percentile75 = 0;
    if (SampleCount > 8)
    {
        offset_t goalOffset = (offset_t)(0.25 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile75 = Samples[goalOffset];
    }

    uint64_t percentile95 = 0;
    if (SampleCount > 40)
    {
        offset_t goalOffset = (offset_t)(0.05 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile95 = Samples[goalOffset];
    }

    uint64_t percentile99 = 0;
    if (SampleCount > 200)
    {
        offset_t goalOffset = (offset_t)(0.01 * SampleCount);
        std::nth_element(Samples.begin(), Samples.begin() + goalOffset, Samples.begin() + SampleCount,
            [](uint64_t a, uint64_t b)->bool {
            return a < b;
        });
        percentile99 = Samples[goalOffset];
    }

    Logger.Info("One-way  1% percentile latency = ", percentile1 / 1000.f, " msec");
    Logger.Info("One-way  5% percentile latency = ", percentile5 / 1000.f, " msec");
    Logger.Info("One-way 25% percentile latency = ", percentile25 / 1000.f, " msec");
    Logger.Info("One-way 50% percentile latency = ", percentile50 / 1000.f, " msec (median)");
    Logger.Info("One-way 75% percentile latency = ", percentile75 / 1000.f, " msec");
    Logger.Info("One-way 95% percentile latency = ", percentile95 / 1000.f, " msec");
    Logger.Info("One-way 99% percentile latency = ", percentile99 / 1000.f, " msec");
}